

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

char * get_option_arg(int argc,char **argv,int *i)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  ushort **ppuVar4;
  
  iVar1 = *i;
  pcVar2 = argv[iVar1];
  if (pcVar2[2] != '\0') {
    return pcVar2 + 2;
  }
  *i = iVar1 + 1;
  if (iVar1 + 1 < argc) {
    pcVar3 = argv[(long)iVar1 + 1];
    if (*pcVar3 != '-') {
      return pcVar3;
    }
    ppuVar4 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar4 + (ulong)(byte)pcVar3[1] * 2 + 1) & 8) != 0) {
      return pcVar3;
    }
  }
  *i = iVar1;
  error(5,(ulong)(uint)(int)pcVar2[1]);
  return (char *)0x0;
}

Assistant:

static char *get_option_arg(int argc,char *argv[],int *i)
/* get pointer to the string, which either directly follows the option
   character or is stored in the next argument */
{
  if (argv[*i][2])
    return &argv[*i][2];
  else {
    if (++*i<argc) {
      /* another option? */
      if (argv[*i][0]!='-' || isdigit((unsigned char)argv[*i][1]))
        return argv[*i];
    }
    --*i;
  }
  error(5,argv[*i][1]);
  return NULL;  /* not reached */
}